

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result * __thiscall
testing::internal::FunctionMocker<ot::commissioner::Error_()>::Invoke
          (Result *__return_storage_ptr__,FunctionMocker<ot::commissioner::Error_()> *this)

{
  ulong in_RAX;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<ot::commissioner::Error> *pAVar1;
  ArgumentTuple tuple;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,(void *)((long)&uStack_18 + 7));
  pAVar1 = DownCast_<testing::internal::ActionResultHolder<ot::commissioner::Error>*,testing::internal::UntypedActionResultHolderBase>
                     (f);
  ot::commissioner::Error::Error(__return_storage_ptr__,&(pAVar1->result_).value_);
  if (pAVar1 != (ActionResultHolder<ot::commissioner::Error> *)0x0) {
    (*(pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase[1])(pAVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }